

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O2

char * cmime_message_generate_boundary(void)

{
  int iVar1;
  long lVar2;
  char local_48 [8];
  char str [21];
  char *local_28;
  char *boundary;
  
  local_28 = (char *)0x0;
  for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 1) {
    iVar1 = cmime_util_rand();
    local_48[lVar2] =
         "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789._-="
         [(ulong)(long)iVar1 % 0x42];
  }
  str[0xc] = '\0';
  asprintf(&local_28,"--=_Part_%s");
  return local_28;
}

Assistant:

char *cmime_message_generate_boundary(void) {
    char str[21];
    char *boundary = NULL;
    int i;
    static const char text[] = "abcdefghijklmnopqrstuvwxyz"
                               "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                               "0123456789._-=";

    for ( i = 0; i < 20; ++i ) {
        str[i] = text[cmime_util_rand() % (sizeof text - 1)];
    }
    str[20] = '\0';
    
    asprintf(&boundary,"--=_Part_%s",str);
    return(boundary);
}